

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_study.c
# Opt level: O0

PCRE2_SPTR8 set_table_bit(pcre2_real_code_8 *re,PCRE2_SPTR8 p,BOOL caseless,BOOL utf,BOOL ucp)

{
  byte bVar1;
  uint uVar2;
  uint32_t c;
  BOOL ucp_local;
  BOOL utf_local;
  BOOL caseless_local;
  PCRE2_SPTR8 p_local;
  pcre2_real_code_8 *re_local;
  
  bVar1 = *p;
  re->start_bitmap[bVar1 >> 3] = re->start_bitmap[bVar1 >> 3] | (byte)(1 << (bVar1 & 7));
  if (caseless != 0) {
    uVar2 = re->tables[bVar1 + 0x100] / 8;
    re->start_bitmap[(int)uVar2] =
         re->start_bitmap[(int)uVar2] | (byte)(1 << (re->tables[bVar1 + 0x100] & 7));
  }
  return p + 1;
}

Assistant:

static PCRE2_SPTR
set_table_bit(pcre2_real_code *re, PCRE2_SPTR p, BOOL caseless, BOOL utf,
  BOOL ucp)
{
uint32_t c = *p++;   /* First code unit */

(void)utf;           /* Stop compiler warnings when UTF not supported */
(void)ucp;

/* In 16-bit and 32-bit modes, code units greater than 0xff set the bit for
0xff. */

#if PCRE2_CODE_UNIT_WIDTH != 8
if (c > 0xff) SET_BIT(0xff); else
#endif

SET_BIT(c);

/* In UTF-8 or UTF-16 mode, pick up the remaining code units in order to find
the end of the character, even when caseless. */

#ifdef SUPPORT_UNICODE
if (utf)
  {
#if PCRE2_CODE_UNIT_WIDTH == 8
  if (c >= 0xc0) GETUTF8INC(c, p);
#elif PCRE2_CODE_UNIT_WIDTH == 16
  if ((c & 0xfc00) == 0xd800) GETUTF16INC(c, p);
#endif
  }
#endif  /* SUPPORT_UNICODE */

/* If caseless, handle the other case of the character. */

if (caseless)
  {
#ifdef SUPPORT_UNICODE
  if (utf || ucp)
    {
    c = UCD_OTHERCASE(c);
#if PCRE2_CODE_UNIT_WIDTH == 8
    if (utf)
      {
      PCRE2_UCHAR buff[6];
      (void)PRIV(ord2utf)(c, buff);
      SET_BIT(buff[0]);
      }
    else if (c < 256) SET_BIT(c);
#else  /* 16-bit or 32-bit mode */
    if (c > 0xff) SET_BIT(0xff); else SET_BIT(c);
#endif
    }

  else
#endif  /* SUPPORT_UNICODE */

  /* Not UTF or UCP */

  if (MAX_255(c)) SET_BIT(re->tables[fcc_offset + c]);
  }

return p;
}